

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O1

void __thiscall lts2::LBDOperator::~LBDOperator(LBDOperator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

lts2::LBDOperator::~LBDOperator()
{
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    if (_basisFunctions)
      delete[]_basisFunctions;
}